

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

string_type * __thiscall
toml::basic_value<toml::type_config>::as_string_abi_cxx11_(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == string) {
    return (string_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"toml::value::as_string()","")
  ;
  throw_bad_cast(this,&local_38,string);
}

Assistant:

string_type const& as_string() const
    {
        if(this->type_ != value_t::string)
        {
            this->throw_bad_cast("toml::value::as_string()", value_t::string);
        }
        return this->string_.value;
    }